

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void __thiscall
DWallLightTransfer::DWallLightTransfer
          (DWallLightTransfer *this,sector_t *srcSec,int target,BYTE flags)

{
  int iVar1;
  FLineIdIterator local_3c;
  FLineIdIterator itr;
  byte local_28;
  int wallflags;
  int linenum;
  BYTE flags_local;
  int target_local;
  sector_t *srcSec_local;
  DWallLightTransfer *this_local;
  
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_009fb2d8;
  this->Source = srcSec;
  this->TargetID = target;
  this->Flags = flags;
  iVar1 = sector_t::GetLightLevel(srcSec);
  this->LastLight = (short)iVar1;
  DoTransfer((short)iVar1,target,this->Flags);
  if ((flags & 4) == 0) {
    local_28 = 1;
  }
  else {
    local_28 = 5;
  }
  FLineIdIterator::FLineIdIterator(&local_3c,target);
  while (iVar1 = FLineIdIterator::Next(&local_3c), -1 < iVar1) {
    if (((flags & 1) != 0) && (lines[iVar1].sidedef[0] != (side_t *)0x0)) {
      lines[iVar1].sidedef[0]->Flags = lines[iVar1].sidedef[0]->Flags | local_28;
    }
    if (((flags & 2) != 0) && (lines[iVar1].sidedef[1] != (side_t *)0x0)) {
      lines[iVar1].sidedef[1]->Flags = lines[iVar1].sidedef[1]->Flags | local_28;
    }
  }
  DThinker::ChangeStatNum(&this->super_DThinker,0x27);
  return;
}

Assistant:

DWallLightTransfer::DWallLightTransfer (sector_t *srcSec, int target, BYTE flags)
{
	int linenum;
	int wallflags;

	Source = srcSec;
	TargetID = target;
	Flags = flags;
	DoTransfer (LastLight = srcSec->GetLightLevel(), target, Flags);

	if (!(flags & WLF_NOFAKECONTRAST))
	{
		wallflags = WALLF_ABSLIGHTING;
	}
	else
	{
		wallflags = WALLF_ABSLIGHTING | WALLF_NOFAKECONTRAST;
	}

	FLineIdIterator itr(target);
	while ((linenum = itr.Next()) >= 0)
	{
		if (flags & WLF_SIDE1 && lines[linenum].sidedef[0] != NULL)
		{
			lines[linenum].sidedef[0]->Flags |= wallflags;
		}

		if (flags & WLF_SIDE2 && lines[linenum].sidedef[1] != NULL)
		{
			lines[linenum].sidedef[1]->Flags |= wallflags;
		}
	}
	ChangeStatNum(STAT_LIGHTTRANSFER);
}